

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rga.cpp
# Opt level: O0

MPP_RET rga_init(RgaCtx *ctx)

{
  int iVar1;
  int *local_20;
  RgaCtxImpl *impl;
  MPP_RET ret;
  RgaCtx *ctx_local;
  
  impl._4_4_ = MPP_OK;
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"in\n","rga_init");
  }
  *ctx = (RgaCtx)0x0;
  local_20 = (int *)mpp_osal_malloc("rga_init",0x130);
  if (local_20 == (int *)0x0) {
    _mpp_log_l(2,0,"malloc context failed\n","rga_init");
    impl._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    iVar1 = open("/dev/rga",0x80002,0);
    *local_20 = iVar1;
    if (*local_20 < 0) {
      _mpp_log_l(2,0,"open device failed\n","rga_init");
      mpp_osal_free("rga_init",local_20);
      local_20 = (int *)0x0;
      impl._4_4_ = MPP_ERR_OPEN_FILE;
    }
  }
  *ctx = local_20;
  if ((rga_debug & 1) != 0) {
    _mpp_log_l(4,0,"out\n","rga_init");
  }
  return impl._4_4_;
}

Assistant:

MPP_RET rga_init(RgaCtx *ctx)
{
    MPP_RET ret = MPP_OK;
    RgaCtxImpl *impl = NULL;

    rga_dbg_func("in\n");

    *ctx = NULL;

    impl = mpp_malloc(RgaCtxImpl, 1);
    if (!impl) {
        mpp_err_f("malloc context failed\n");
        ret = MPP_ERR_NULL_PTR;
        goto END;
    }

    impl->rga_fd = open(DEFAULT_RGA_DEV, O_RDWR | O_CLOEXEC, 0);
    if (impl->rga_fd < 0) {
        mpp_err_f("open device failed\n");
        mpp_free(impl);
        impl = NULL;
        ret = MPP_ERR_OPEN_FILE;
        goto END;
    }

END:
    *ctx = impl;
    rga_dbg_func("out\n");
    return ret;
}